

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGridHeader.cpp
# Opt level: O2

void __thiscall PatternGridHeader::changeEvent(PatternGridHeader *this,QEvent *evt)

{
  QFont font_;
  
  if ((*(short *)(evt + 8) == 0x61) && (this->mUpdatingFont == false)) {
    this->mUpdatingFont = true;
    QFont::QFont(&font_,(QFont *)(*(long *)&this->field_0x20 + 0x38));
    QFont::setPixelSize((int)&font_);
    QWidget::setFont((QFont *)this);
    this->mUpdatingFont = false;
    QFont::~QFont(&font_);
  }
  return;
}

Assistant:

void PatternGridHeader::changeEvent(QEvent *evt) {
    if (evt->type() == QEvent::FontChange) {
        if (!mUpdatingFont) {
            mUpdatingFont = true;

            // force the set font to have a height of 12 pixels
            auto font_ = font();
            font_.setPixelSize(12);
            setFont(font_);

            mUpdatingFont = false;
        }
    }
}